

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tester.h
# Opt level: O3

void __thiscall
density_tests::
QueueGenericTester<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
::add_test_case(QueueGenericTester<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
                *this,runtime_type *i_type,PutTestCase i_put_func,
               ReentrantPutTestCase i_reentrant_put_func,ConsumeTestCase i_consume_func,
               ReentrantConsumeTestCase i_reentrant_consume_func)

{
  iterator __position;
  iterator __position_00;
  iterator __position_01;
  iterator __position_02;
  pair<std::__detail::_Node_iterator<std::pair<const_density::runtime_type<>,_unsigned_long>,_false,_false>,_bool>
  pVar1;
  ReentrantConsumeTestCase local_58;
  ConsumeTestCase local_50;
  ReentrantPutTestCase local_48;
  PutTestCase local_40;
  tuple_type *local_38;
  long local_30;
  
  local_30 = *(long *)(this + 0x48) - *(long *)(this + 0x40) >> 3;
  local_38 = i_type->m_feature_table;
  local_58 = i_reentrant_consume_func;
  local_50 = i_consume_func;
  local_48 = i_reentrant_put_func;
  local_40 = i_put_func;
  pVar1 = std::
          _Hashtable<density::runtime_type<>,std::pair<density::runtime_type<>const,unsigned_long>,std::allocator<std::pair<density::runtime_type<>const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<density::runtime_type<>>,std::hash<density::runtime_type<>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<std::pair<density::runtime_type<>,unsigned_long>>
                    ((_Hashtable<density::runtime_type<>,std::pair<density::runtime_type<>const,unsigned_long>,std::allocator<std::pair<density::runtime_type<>const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<density::runtime_type<>>,std::hash<density::runtime_type<>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)(this + 8));
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    detail::assert_failed<>
              ("result.second",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/../../test_framework/queue_generic_tester.h"
               ,0x48);
  }
  __position._M_current =
       *(_func_bool_conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_ptr_EasyRandom_ptr
         ***)(this + 0x48);
  if (__position._M_current ==
      *(_func_bool_conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_ptr_EasyRandom_ptr
        ***)(this + 0x50)) {
    std::
    vector<bool(*)(density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>&,density_tests::EasyRandom&),std::allocator<bool(*)(density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>&,density_tests::EasyRandom&)>>
    ::
    _M_realloc_insert<bool(*const&)(density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>&,density_tests::EasyRandom&)>
              ((vector<bool(*)(density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>&,density_tests::EasyRandom&),std::allocator<bool(*)(density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>&,density_tests::EasyRandom&)>>
                *)(this + 0x40),__position,&local_40);
  }
  else {
    *__position._M_current = i_put_func;
    *(long *)(this + 0x48) = *(long *)(this + 0x48) + 8;
  }
  __position_00._M_current =
       *(_func_reentrant_put_transaction<void>_conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_ptr_EasyRandom_ptr_conflict
         ***)(this + 0x78);
  if (__position_00._M_current ==
      *(_func_reentrant_put_transaction<void>_conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_ptr_EasyRandom_ptr_conflict
        ***)(this + 0x80)) {
    std::
    vector<density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::reentrant_put_transaction<void>(*)(density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>&,density_tests::EasyRandom&),std::allocator<density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::reentrant_put_transaction<void>(*)(density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>&,density_tests::EasyRandom&)>>
    ::
    _M_realloc_insert<density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::reentrant_put_transaction<void>(*const&)(density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>&,density_tests::EasyRandom&)>
              ((vector<density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::reentrant_put_transaction<void>(*)(density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>&,density_tests::EasyRandom&),std::allocator<density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::reentrant_put_transaction<void>(*)(density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>&,density_tests::EasyRandom&)>>
                *)(this + 0x70),__position_00,&local_48);
  }
  else {
    *__position_00._M_current = i_reentrant_put_func;
    *(long *)(this + 0x78) = *(long *)(this + 0x78) + 8;
  }
  __position_01._M_current = *(_func_void_consume_operation_ptr_conflict1 ***)(this + 0x60);
  if (__position_01._M_current == *(_func_void_consume_operation_ptr_conflict1 ***)(this + 0x68)) {
    std::
    vector<void(*)(density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::consume_operation_const&),std::allocator<void(*)(density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::consume_operation_const&)>>
    ::
    _M_realloc_insert<void(*const&)(density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::consume_operation_const&)>
              ((vector<void(*)(density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::consume_operation_const&),std::allocator<void(*)(density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::consume_operation_const&)>>
                *)(this + 0x58),__position_01,&local_50);
  }
  else {
    *__position_01._M_current = i_consume_func;
    *(long *)(this + 0x60) = *(long *)(this + 0x60) + 8;
  }
  __position_02._M_current =
       *(_func_void_reentrant_consume_operation_ptr_conflict1 ***)(this + 0x90);
  if (__position_02._M_current ==
      *(_func_void_reentrant_consume_operation_ptr_conflict1 ***)(this + 0x98)) {
    std::
    vector<void(*)(density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::reentrant_consume_operation_const&),std::allocator<void(*)(density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::reentrant_consume_operation_const&)>>
    ::
    _M_realloc_insert<void(*const&)(density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::reentrant_consume_operation_const&)>
              ((vector<void(*)(density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::reentrant_consume_operation_const&),std::allocator<void(*)(density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::reentrant_consume_operation_const&)>>
                *)(this + 0x88),__position_02,&local_58);
  }
  else {
    *__position_02._M_current = i_reentrant_consume_func;
    *(long *)(this + 0x90) = *(long *)(this + 0x90) + 8;
  }
  return;
}

Assistant:

void add_test_case(
          const typename QUEUE::runtime_type & i_type,
          PutTestCase                          i_put_func,
          ReentrantPutTestCase                 i_reentrant_put_func,
          ConsumeTestCase                      i_consume_func,
          ReentrantConsumeTestCase             i_reentrant_consume_func)
        {
            auto result = m_element_types.insert(std::make_pair(i_type, m_put_cases.size()));
            DENSITY_TEST_ASSERT(result.second);

            m_put_cases.push_back(i_put_func);
            m_reentrant_put_cases.push_back(i_reentrant_put_func);
            m_consume_cases.push_back(i_consume_func);
            m_reentrant_consume_cases.push_back(i_reentrant_consume_func);
        }